

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

int lws_sa46_compare_ads(lws_sockaddr46 *sa46a,lws_sockaddr46 *sa46b)

{
  lws_sockaddr46 *sa46b_local;
  lws_sockaddr46 *sa46a_local;
  
  if ((sa46a->sa4).sin_family == (sa46b->sa4).sin_family) {
    sa46a_local._4_4_ = (uint)((sa46a->sa4).sin_addr.s_addr != (sa46b->sa4).sin_addr.s_addr);
  }
  else {
    sa46a_local._4_4_ = 1;
  }
  return sa46a_local._4_4_;
}

Assistant:

int
lws_sa46_compare_ads(const lws_sockaddr46 *sa46a, const lws_sockaddr46 *sa46b)
{
	if (sa46a->sa4.sin_family != sa46b->sa4.sin_family)
		return 1;

#if defined(LWS_WITH_IPV6)
	if (sa46a->sa4.sin_family == AF_INET6)
		return memcmp(&sa46a->sa6.sin6_addr, &sa46b->sa6.sin6_addr, 16);
#endif

	return sa46a->sa4.sin_addr.s_addr != sa46b->sa4.sin_addr.s_addr;
}